

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void add_passes(Backend *backend)

{
  vector<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>,_std::allocator<std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>_>_>
  *this;
  pointer __p;
  tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_> tVar1;
  char *pcVar2;
  vector<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>,_std::allocator<std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>_>_>
  *this_00;
  size_type __dnew;
  VarMirFold *local_1a0;
  _Head_base<0UL,_backend::MirOptimizePass_*,_false> local_198;
  __uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
  local_190;
  __uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
  local_188;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_180;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_178;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_170;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_168;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_160;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_158;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_150;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_148;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_140;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_138;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_130;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_128;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_120;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_118;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_110;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_108;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
  local_100;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_f8
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_f0
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_e8
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_e0
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_d8
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_d0
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_c8
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_c0
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_b8
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_b0
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_a8
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_a0
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_98
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_90
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_88
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_80
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_78
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_70
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_68
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_60
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_58
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_50
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_48
  ;
  __uniq_ptr_impl<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> local_40
  ;
  __uniq_ptr_impl<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> local_38
  ;
  
  local_40._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x10);
  *(long *)local_40._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_40._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(undefined ***)
   local_40._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb088;
  this = &backend->mir_passes;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_40);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_48._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)local_48._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) = 0
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(undefined ***)
   local_48._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb148;
  *(long **)((long)local_48._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) =
       (long *)((long)local_48._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_48._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       (long *)((long)local_48._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_48._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) =
       (long *)((long)local_48._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48)
  ;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       0x655465766f6d6552;
  *(undefined8 *)
   ((long)local_48._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x4d) =
       0x726156706d655465;
  *(long *)((long)local_48._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       0xd;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_48);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_48._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_48._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_48._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x28);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb208;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x10;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"ConstPropagation",0x10);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  local_50._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_50);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_50._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_50._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_50._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_198._M_head_impl = (MirOptimizePass *)operator_new(0x28);
  local_198._M_head_impl[4]._vptr_MirOptimizePass = (_func_int **)0x0;
  (local_198._M_head_impl)->_vptr_MirOptimizePass = (_func_int **)&PTR_pass_name_abi_cxx11__001eb250
  ;
  local_198._M_head_impl[1]._vptr_MirOptimizePass = (_func_int **)(local_198._M_head_impl + 3);
  local_198._M_head_impl[3]._vptr_MirOptimizePass = (_func_int **)0x6f4672694d726156;
  *(undefined2 *)&local_198._M_head_impl[4]._vptr_MirOptimizePass = 0x646c;
  local_198._M_head_impl[2]._vptr_MirOptimizePass = (_func_int **)0xa;
  local_1a0 = (VarMirFold *)0x0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_198);
  if (local_198._M_head_impl != (MirOptimizePass *)0x0) {
    (*(local_198._M_head_impl)->_vptr_MirOptimizePass[3])();
  }
  local_198._M_head_impl = (MirOptimizePass *)0x0;
  if (local_1a0 != (VarMirFold *)0x0) {
    std::default_delete<optimization::var_mir_fold::VarMirFold>::operator()
              ((default_delete<optimization::var_mir_fold::VarMirFold> *)&local_1a0,local_1a0);
  }
  local_58._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)((long)local_58._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_58._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_58._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_58._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(undefined ***)
   local_58._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb298;
  *(long **)((long)local_58._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)local_58._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  *(long *)((long)local_58._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) =
       0x654465766f6d6552;
  *(undefined8 *)
   ((long)local_58._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x1e) =
       0x65646f4364616544;
  *(long *)((long)local_58._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       0xe;
  *(long **)((long)local_58._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_58._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long **)((long)local_58._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)local_58._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long *)((long)local_58._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_58);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_58._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_58._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_58._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x90);
  optimization::inlineFunc::Inline_Func::Inline_Func
            ((Inline_Func *)
             tVar1.
             super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
             .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl,true);
  local_60._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_60);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_60._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_60._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_60._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_68._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x60);
  *(long *)local_68._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x58) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(undefined ***)
   local_68._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb440;
  *(long **)((long)local_68._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) =
       (long *)((long)local_68._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_68._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       (long *)((long)local_68._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_68._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) =
       (long *)((long)local_68._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48)
  ;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       0x6f6c42656772654d;
  *(undefined2 *)
   ((long)local_68._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0x6b63;
  *(long *)((long)local_68._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       10;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_68);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_68._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_68._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_68._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x60);
  optimization::common_expr_del::Common_Expr_Del::Common_Expr_Del
            ((Common_Expr_Del *)
             tVar1.
             super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
             .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl,false);
  local_70._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_70);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_70._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_70._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_70._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x30);
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb630;
  *(undefined1 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20)
  ;
  local_1a0 = (VarMirFold *)0x15;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 0x10),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = local_1a0
  ;
  builtin_strncpy(pcVar2,"Global expression mov",0x15);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)) =
       0;
  local_78._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_78);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_78._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_78._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_78._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x60);
  optimization::common_expr_del::Common_Expr_Del::Common_Expr_Del
            ((Common_Expr_Del *)
             tVar1.
             super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
             .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl,false);
  local_80._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_80);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_80._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_80._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_80._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_88._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)((long)local_88._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_88._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_88._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_88._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(undefined ***)
   local_88._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb298;
  *(long **)((long)local_88._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)local_88._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  *(long *)((long)local_88._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) =
       0x654465766f6d6552;
  *(undefined8 *)
   ((long)local_88._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x1e) =
       0x65646f4364616544;
  *(long *)((long)local_88._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       0xe;
  *(long **)((long)local_88._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_88._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long **)((long)local_88._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)local_88._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long *)((long)local_88._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_88);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_88._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_88._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_88._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x60);
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb6f8;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x14;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"MemoryVarPropagation",0x14);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  *(undefined1 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38)
  ;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38)
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x58) = 0
  ;
  local_90._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_90);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_90._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_90._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_90._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_98._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)local_98._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) = 0
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(undefined ***)
   local_98._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb758;
  *(long **)((long)local_98._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) =
       (long *)((long)local_98._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_98._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       (long *)((long)local_98._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_98._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) =
       (long *)((long)local_98._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48)
  ;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       0x6e6f43656772654d;
  *(undefined2 *)
   ((long)local_98._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0x7473;
  *(long *)((long)local_98._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       10;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_98);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_98._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_98._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_98._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x60);
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb6f8;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x14;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"MemoryVarPropagation",0x14);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  *(undefined1 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38)
  ;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38)
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x58) = 0
  ;
  local_a0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_a0);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_a0._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_a0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x28);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb208;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x10;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"ConstPropagation",0x10);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  local_a8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_a8);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_a8._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_a8._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_a8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_b0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_b0._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ebf08;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_b0);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_b0._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_b0._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_b0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_b8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x60);
  *(long *)local_b8._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x58) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(undefined ***)
   local_b8._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb440;
  *(long **)((long)local_b8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) =
       (long *)((long)local_b8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_b8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       (long *)((long)local_b8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_b8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) =
       (long *)((long)local_b8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48)
  ;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       0x6f6c42656772654d;
  *(undefined2 *)
   ((long)local_b8._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0x6b63;
  *(long *)((long)local_b8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       10;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_b8);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_b8._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_b8._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_b8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x28);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb208;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x10;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"ConstPropagation",0x10);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  local_c0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_c0);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_c0._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_c0._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_c0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_c8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)local_c8._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) = 0
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(undefined ***)
   local_c8._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb758;
  *(long **)((long)local_c8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) =
       (long *)((long)local_c8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_c8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       (long *)((long)local_c8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_c8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) =
       (long *)((long)local_c8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48)
  ;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       0x6e6f43656772654d;
  *(undefined2 *)
   ((long)local_c8._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0x7473;
  *(long *)((long)local_c8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       10;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_c8);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_c8._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_c8._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_c8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x28);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb208;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x10;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"ConstPropagation",0x10);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  local_d0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_d0);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_d0._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_d0._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_d0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_d8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)((long)local_d8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_d8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_d8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_d8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(undefined ***)
   local_d8._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb298;
  *(long **)((long)local_d8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)local_d8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  *(long *)((long)local_d8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) =
       0x654465766f6d6552;
  *(undefined8 *)
   ((long)local_d8._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x1e) =
       0x65646f4364616544;
  *(long *)((long)local_d8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       0xe;
  *(long **)((long)local_d8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_d8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long **)((long)local_d8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)local_d8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long *)((long)local_d8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_d8);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_d8._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_d8._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_d8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x60);
  optimization::common_expr_del::Common_Expr_Del::Common_Expr_Del
            ((Common_Expr_Del *)
             tVar1.
             super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
             .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl,false);
  local_e0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_e0);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_e0._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_e0._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_e0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x60);
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb6f8;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x14;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"MemoryVarPropagation",0x14);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  *(undefined1 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38)
  ;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38)
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x58) = 0
  ;
  local_e8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_e8);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_e8._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_e8._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_e8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x28);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb208;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x10;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"ConstPropagation",0x10);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  local_f0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_f0);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_f0._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_f0._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_f0._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_f8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)local_f8._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) = 0
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(undefined ***)
   local_f8._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb758;
  *(long **)((long)local_f8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) =
       (long *)((long)local_f8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_f8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       (long *)((long)local_f8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_f8._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) =
       (long *)((long)local_f8._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48)
  ;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       0x6e6f43656772654d;
  *(undefined2 *)
   ((long)local_f8._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0x7473;
  *(long *)((long)local_f8._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       10;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_f8);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_f8._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_f8._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_f8._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x28);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb208;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x10;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"ConstPropagation",0x10);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  local_100._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_100);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_100._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_100._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_100._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_108._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x60);
  *(long *)local_108._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x58) = 0
  ;
  *(undefined ***)
   local_108._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb7f0;
  *(long **)((long)local_108._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) =
       (long *)((long)local_108._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_108._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       (long *)((long)local_108._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_108._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) =
       (long *)((long)local_108._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48)
  ;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       0x74736e4974736143;
  *(long *)((long)local_108._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 8
  ;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_108);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_108._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_108._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_108._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x60);
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb6f8;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x14;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"MemoryVarPropagation",0x14);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  *(undefined1 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 1;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38)
  ;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38)
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x58) = 0
  ;
  local_110._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_110);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_110._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_110._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_110._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x60);
  optimization::common_expr_del::Common_Expr_Del::Common_Expr_Del
            ((Common_Expr_Del *)
             tVar1.
             super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
             .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl,true);
  local_118._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_118);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_118._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_118._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_118._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x30);
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb630;
  *(undefined1 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 1;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20)
  ;
  local_1a0 = (VarMirFold *)0x15;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 0x10),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = local_1a0
  ;
  builtin_strncpy(pcVar2,"Global expression mov",0x15);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)) =
       0;
  local_120._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_120);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_120._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_120._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_120._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_128._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)((long)local_128._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_128._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_128._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_128._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(undefined ***)
   local_128._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb298;
  *(long **)((long)local_128._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)local_128._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  *(long *)((long)local_128._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) =
       0x654465766f6d6552;
  *(undefined8 *)
   ((long)local_128._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x1e) =
       0x65646f4364616544;
  *(long *)((long)local_128._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       0xe;
  *(long **)((long)local_128._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_128._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long **)((long)local_128._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)local_128._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long *)((long)local_128._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_128);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_128._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_128._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_128._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x28);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb838;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  local_1a0 = (VarMirFold *)0x17;
  pcVar2 = (char *)std::__cxx11::string::_M_create
                             ((ulong *)((long)tVar1.
                                              super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                                              .
                                              super__Head_base<0UL,_backend::MirOptimizePass_*,_false>
                                              ._M_head_impl + 8),(ulong)&local_1a0);
  *(char **)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       pcVar2;
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = local_1a0
  ;
  builtin_strncpy(pcVar2,"AlgebraicSimplification",0x17);
  *(VarMirFold **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = local_1a0
  ;
  *(undefined1 *)
   ((long)&(local_1a0->super_MirOptimizePass)._vptr_MirOptimizePass +
   *(long *)((long)tVar1.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8)) = 0;
  local_130._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_130);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_130._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_130._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_130._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_138._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_138._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ec088;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_138);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_138._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_138._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_138._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_140._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_140._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ec0d0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_140);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_140._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_140._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_140._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_148._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_148._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ec2a0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_148);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_148._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_148._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_148._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_150._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_150._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ec040;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_150);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_150._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_150._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_150._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_158._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x58);
  *(long *)((long)local_158._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_158._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_158._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_158._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(undefined ***)
   local_158._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb298;
  *(long **)((long)local_158._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)local_158._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  *(long *)((long)local_158._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) =
       0x654465766f6d6552;
  *(undefined8 *)
   ((long)local_158._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x1e) =
       0x65646f4364616544;
  *(long *)((long)local_158._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) =
       0xe;
  *(long **)((long)local_158._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_158._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long **)((long)local_158._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       (long *)((long)local_158._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30)
  ;
  *(long *)((long)local_158._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_158);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_158._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_158._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_158._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_160._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x60);
  *(long *)local_160._M_t.
           super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
           .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl = 0;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x58) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 0
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) = 0
  ;
  *(undefined ***)
   local_160._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb440;
  *(long **)((long)local_160._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) =
       (long *)((long)local_160._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_160._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       (long *)((long)local_160._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10)
  ;
  *(long **)((long)local_160._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x38) =
       (long *)((long)local_160._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48)
  ;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x48) =
       0x6f6c42656772654d;
  *(undefined2 *)
   ((long)local_160._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x50) = 0x6b63;
  *(long *)((long)local_160._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x40) =
       10;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_160);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_160._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_160._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_160._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_168._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_168._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ebf50;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_168);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_168._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_168._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_168._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_170._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_170._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ec2a0;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_170);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_170._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_170._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_170._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_178._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       operator_new(0x38);
  *(long *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0
  ;
  *(long *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) = 0
  ;
  *(long *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 0
  ;
  *(undefined ***)
   local_178._M_t.
   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001eb8d0;
  *(long **)((long)local_178._M_t.
                   super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                   .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 8) =
       (long *)((long)local_178._M_t.
                      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18)
  ;
  *(long *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x18) =
       0x6e756f6320666552;
  *(undefined1 *)
   ((long)local_178._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x20) = 0x74;
  *(long *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x10) = 9
  ;
  *(long *)((long)local_178._M_t.
                  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x28) =
       0x186a000000014;
  *(undefined4 *)
   ((long)local_178._M_t.
          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl + 0x30) = 1;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_178);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_178._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_178._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_178._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  tVar1.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )operator_new(0x138);
  optimization::graph_color::Graph_Color::Graph_Color
            ((Graph_Color *)
             tVar1.
             super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
             .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl,7,true);
  local_180._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       tVar1.
       super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>
            ((vector<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>,std::allocator<std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>>>
              *)this,(unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
                      *)&local_180);
  if ((_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
      local_180._M_t.
      super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
      .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl !=
      (MirOptimizePass *)0x0) {
    (**(code **)(*(long *)local_180._M_t.
                          super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
                          .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_180._M_t.
  super__Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
  .super__Head_base<0UL,_backend::MirOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::MirOptimizePass_*,_std::default_delete<backend::MirOptimizePass>_>
       )0x0;
  local_188._M_t.
  super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
  .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_188._M_t.
   super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
   .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ec388;
  this_00 = &backend->arm_passes;
  std::
  vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>
            ((vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
              *)this_00,
             (unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *
             )&local_188);
  if ((_Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>)
      local_188._M_t.
      super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
      .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl !=
      (ArmOptimizePass *)0x0) {
    (**(code **)(*(long *)local_188._M_t.
                          super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
                          .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_188._M_t.
  super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
  .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
       )0x0;
  local_190._M_t.
  super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
  .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_190._M_t.
   super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
   .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ec340;
  std::
  vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>
            ((vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
              *)this_00,
             (unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *
             )&local_190);
  if ((_Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>)
      local_190._M_t.
      super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
      .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl !=
      (ArmOptimizePass *)0x0) {
    (**(code **)(*(long *)local_190._M_t.
                          super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
                          .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  local_190._M_t.
  super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
  .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>)
       (_Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
       )0x0;
  local_38._M_t.
  super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
  .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl =
       (tuple<backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>)
       operator_new(8);
  *(undefined ***)
   local_38._M_t.
   super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
   .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl =
       &PTR_pass_name_abi_cxx11__001ebe08;
  std::
  vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
  ::
  emplace_back<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>
            ((vector<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>,std::allocator<std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>>>
              *)this_00,
             (unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *
             )&local_38);
  if ((_Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
      .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl !=
      (ArmOptimizePass *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_backend::ArmOptimizePass_*,_std::default_delete<backend::ArmOptimizePass>_>
                          .super__Head_base<0UL,_backend::ArmOptimizePass_*,_false>._M_head_impl +
                0x18))();
  }
  return;
}

Assistant:

void add_passes(backend::Backend& backend) {
  backend.add_pass(std::make_unique<optimization::sanity_check::SanityCheck>());
  backend.add_pass(
      std::make_unique<optimization::remove_temp_var::Remove_Temp_Var>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::var_mir_fold::VarMirFold>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(std::make_unique<optimization::inlineFunc::Inline_Func>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  // inside block only and remove tmp vars
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());

  backend.add_pass(
      std::make_unique<optimization::global_expr_move::Global_Expr_Mov>());

  // delete common exprs new created and replace not phi vars
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());

  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  // backend.add_pass(
  //     std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<optimization::loop_expand::Const_Loop_Expand>());
  // backend.add_pass(
  //     std::make_unique<optimization::loop_unrolling::Loop_Unrolling>());
  // backend.add_pass(
  //     std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  // backend.add_pass(
  //     std::make_unique<optimization::common_expr_del::Common_Expr_Del>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());

  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::cast_inst::Cast_Inst>());
  backend.add_pass(
      std::make_unique<
          optimization::memvar_propagation::Memory_Var_Propagation>(true));
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>(true));
  backend.add_pass(
      std::make_unique<optimization::global_expr_move::Global_Expr_Mov>(true));
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<
          optimization::algebraic_simplification::AlgebraicSimplification>());
  backend.add_pass(std::make_unique<
                   optimization::value_shift_collapse::ValueShiftCollapse>());
  backend.add_pass(std::make_unique<optimization::mla::MlaPass>());
  backend.add_pass(std::make_unique<backend::codegen::BasicBlkRearrange>());
  backend.add_pass(std::make_unique<
                   optimization::complex_dce::ComplexDeadCodeElimination>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  // backend.add_pass(std::make_unique<optimization::cycle::Cycle>());
  // backend.add_pass(std::make_unique<optimization::exit_ahead::Exit_Ahead>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  backend.add_pass(
      std::make_unique<optimization::func_array_global::Func_Array_Global>());
  backend.add_pass(std::make_unique<backend::codegen::BasicBlkRearrange>());
  // fft will error.
  // backend.add_pass(std::make_unique<
  //                  optimization::global_var_to_local::Global_Var_to_Local>());
  backend.add_pass(std::make_unique<optimization::ref_count::Ref_Count>());
  backend.add_pass(
      std::make_unique<optimization::graph_color::Graph_Color>(7, true));

  // ARM Passes
  backend.add_pass(std::make_unique<backend::codegen::MathOptimization>());
  backend.add_pass(std::make_unique<backend::codegen::RegAllocatePass>());
  backend.add_pass(std::make_unique<backend::optimization::ExcessRegDelete>());
  // backend.add_pass(std::make_unique<backend::codegen::CodeAlignOptimization>());
}